

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

int32 google::protobuf::strto32_adaptor(char *nptr,char **endptr,int base)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  *piVar3 = 0;
  lVar4 = strtol(nptr,endptr,base);
  iVar2 = *piVar3;
  if (iVar2 == 0x22 && lVar4 == -0x8000000000000000) {
    return -0x80000000;
  }
  if (iVar2 != 0x22 || lVar4 != 0x7fffffffffffffff) {
    if (lVar4 < -0x80000000 && iVar2 == 0) {
      *piVar3 = 0x22;
      return -0x80000000;
    }
    if (lVar4 < 0x80000000 || iVar2 != 0) {
      if (iVar2 == 0) {
        *piVar3 = iVar1;
      }
      return (int32)lVar4;
    }
    *piVar3 = 0x22;
  }
  return 0x7fffffff;
}

Assistant:

int32 strto32_adaptor(const char *nptr, char **endptr, int base) {
  const int saved_errno = errno;
  errno = 0;
  const long result = strtol(nptr, endptr, base);
  if (errno == ERANGE && result == LONG_MIN) {
    return kint32min;
  } else if (errno == ERANGE && result == LONG_MAX) {
    return kint32max;
  } else if (errno == 0 && result < kint32min) {
    errno = ERANGE;
    return kint32min;
  } else if (errno == 0 && result > kint32max) {
    errno = ERANGE;
    return kint32max;
  }
  if (errno == 0)
    errno = saved_errno;
  return static_cast<int32>(result);
}